

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test6::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test6 *this,_test_case *test_case)

{
  ostream *poVar1;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  stringstream result_sstream;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,
                  "#version 420\n\nlayout(points)                 in;\nlayout(max_vertices=1, points) out;\n\nvoid main()\n{\n"
                 );
  Utils::getVariableTypeString_abi_cxx11_(&sStack_1c8,(Utils *)(ulong)test_case->src_type,type);
  poVar1 = std::operator<<(&local_198,(string *)&sStack_1c8);
  std::operator<<(poVar1," src");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  if (1 < test_case->src_array_size) {
    poVar1 = std::operator<<(&local_198,"[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"]");
  }
  std::operator<<(&local_198,";\n");
  if (test_case->wrap_dst_type_in_structure == true) {
    poVar1 = std::operator<<(&local_198,"struct\n{\n");
    Utils::getVariableTypeString_abi_cxx11_(&sStack_1c8,(Utils *)(ulong)test_case->dst_type,type_01)
    ;
    poVar1 = std::operator<<(poVar1,(string *)&sStack_1c8);
    std::operator<<(poVar1," member");
  }
  else {
    Utils::getVariableTypeString_abi_cxx11_(&sStack_1c8,(Utils *)(ulong)test_case->dst_type,type_00)
    ;
    poVar1 = std::operator<<(&local_198,(string *)&sStack_1c8);
    std::operator<<(poVar1," dst");
  }
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::operator<<(&local_198,";\n\n");
  if (test_case->wrap_dst_type_in_structure == true) {
    std::operator<<(&local_198,"} dst;\n");
  }
  std::operator<<(&local_198,"dst = src;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test6::getGeometryShaderBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Add preamble */
	result_sstream << "#version 420\n"
					  "\n"
					  "layout(points)                 in;\n"
					  "layout(max_vertices=1, points) out;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Add local variable declarations */
	result_sstream << Utils::getVariableTypeString(test_case.src_type) << " src";

	if (test_case.src_array_size > 1)
	{
		result_sstream << "[" << test_case.src_array_size << "]";
	}

	result_sstream << ";\n";

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << "struct\n"
						  "{\n"
					   << Utils::getVariableTypeString(test_case.dst_type) << " member";
	}
	else
	{
		result_sstream << Utils::getVariableTypeString(test_case.dst_type) << " dst";
	}

	result_sstream << ";\n"
					  "\n";

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << "} dst;\n";
	}

	/* Add actual body */
	result_sstream << "dst = src;\n"
					  "}\n";

	/* We're done! */
	return result_sstream.str();
}